

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipeMsg.cpp
# Opt level: O2

int32_t MsgHelper::deserializeMsg(uint8_t *buf,uint32_t len,PipeMsg *msg)

{
  PIPEMSG_TYPE PVar1;
  byte bVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  int32_t iVar6;
  uint8_t *__dest;
  size_t __size;
  uint8_t *__src;
  
  PVar1 = *buf;
  msg->type = PVar1;
  switch(PVar1) {
  case C2S_REQUEST:
    if (1 < len) {
      if (2 < (byte)(buf[1] - 1)) {
        return -1;
      }
      if (len != 2) {
        bVar2 = buf[2];
        if (4 < bVar2) {
          return -1;
        }
        if ((0x1aU >> (bVar2 & 0x1f) & 1) == 0) {
          return -1;
        }
        if (8 < len) {
          if (bVar2 == 4) {
            uVar5 = 0x15;
          }
          else if (bVar2 == 3) {
            if (buf[3] == '\0') {
              return -1;
            }
            uVar5 = (byte)(buf[3] + 1) + 5;
          }
          else {
            uVar5 = 9;
          }
          if (len < uVar5) {
            return 0;
          }
          (msg->field_1).c2s_request.CMD = buf[1];
          iVar6 = resolvAddr(&(msg->field_1).c2s_request.ADDR,buf + 2);
          uVar4 = 0xffffffff;
          if (iVar6 + 2U == uVar5) {
            uVar4 = uVar5;
          }
          return -(uint)(iVar6 == 0) | uVar4;
        }
      }
    }
    goto LAB_001374a5;
  case S2C_RESPONSE:
    uVar3 = 0;
    if (1 < len) {
      if (buf[1] < 5) {
        (msg->field_1).c2s_request.CMD = buf[1];
        uVar3 = 2;
      }
      else {
        uVar3 = 0xffffffff;
      }
    }
    break;
  case SEND_TCP_DATA:
    if (1 < len) {
      if (2 < (byte)(buf[1] - 1)) {
        return -1;
      }
      if (5 < len) {
        uVar3 = readUint32InBigEndian(buf + 2);
        if (uVar3 - 0x40001 < 0xfffc0006) {
          return -1;
        }
        if (len < uVar3) {
          return 0;
        }
        *(uint8_t *)&(msg->field_1).c2s_request.ADDR.PORT = buf[1];
        __size = (size_t)(uVar3 - 6);
        (msg->field_1).common_tcp_data.LEN = uVar3 - 6;
        __dest = (uint8_t *)malloc(__size);
        (msg->field_1).common_tcp_data.DATA = __dest;
        __src = buf + 6;
        goto LAB_00137492;
      }
    }
LAB_001374a5:
    uVar3 = 0;
    break;
  case C2S_UDP_DATA:
  case S2C_UDP_DATA:
    if (len < 2) {
      return 0;
    }
    if (2 < (byte)(buf[1] - 1)) {
      return -1;
    }
    if (len < 7) {
      return 0;
    }
    uVar3 = readUint32InBigEndian(buf + 2);
    if (uVar3 - 0x40001 < 0xfffc000d) {
      return -1;
    }
    bVar2 = buf[6];
    if (4 < bVar2) {
      return -1;
    }
    if ((0x1aU >> (bVar2 & 0x1f) & 1) == 0) {
      return -1;
    }
    if (len == 7) {
      return 0;
    }
    if (bVar2 == 4) {
      uVar5 = 0x10;
    }
    else if (bVar2 == 3) {
      if (buf[7] == '\0') {
        return -1;
      }
      uVar5 = (uint)(byte)(buf[7] + 1);
    }
    else {
      uVar5 = 4;
    }
    if (uVar3 <= uVar5 + 9) {
      return -1;
    }
    if (len < uVar3) {
      return 0;
    }
    *(uint8_t *)&(msg->field_1).c2s_request.ADDR.PORT = buf[1];
    uVar4 = resolvAddr((S5AddrInfo *)((msg->field_1).c2s_request.ADDR.ADDR + 10),buf + 6);
    if (uVar4 == 0) {
      return -1;
    }
    if (uVar4 != uVar5 + 3) {
      return -1;
    }
    uVar5 = (uVar3 - uVar4) - 6;
    if (uVar5 == 0) {
      return -1;
    }
    (msg->field_1).common_tcp_data.LEN = uVar5;
    __size = (size_t)uVar5;
    __dest = (uint8_t *)malloc(__size);
    (msg->field_1).common_tcp_data.DATA = __dest;
    __src = buf + 6 + uVar4;
LAB_00137492:
    memcpy(__dest,__src,__size);
    break;
  case S2C_DISCONNECT:
  case S2C_CANNOT_RESOLVE_ADDR:
    uVar3 = 1;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/PipeMsg.cpp"
                  ,0x115,
                  "static int32_t MsgHelper::deserializeMsg(const uint8_t *, uint32_t, PipeMsg *)");
  }
  return uVar3;
}

Assistant:

int32_t MsgHelper::deserializeMsg(const uint8_t* buf, uint32_t len, PipeMsg* msg)
{
	msg->type = (PIPEMSG_TYPE)buf[0];
	switch(msg->type)
	{
		case PIPEMSG_TYPE::C2S_REQUEST:
		{
			if (len < 2)
				return WAITE_MSG;

			if (false == check_cmd(buf[1]))
				return INVALID_MSG;

			if (len < 3)
				return WAITE_MSG;

			uint8_t ATYP = buf[2];
			if (false == check_atyp(ATYP))
				return INVALID_MSG;

			if (len < 9)
				return WAITE_MSG;

			uint8_t ADDR_LEN = 4;
			if (ATYP == SOKS5_ATYP_DOMAIN)
			{
				if (buf[3] <= 0)
					return INVALID_MSG;
				ADDR_LEN = buf[3] + 1;
			}
			else if (ATYP == SOKS5_ATYP_IPV6)
			{
				ADDR_LEN = 16;
			}

			int msgLen = 3 + ADDR_LEN + 2;
			if (len < msgLen)
				return WAITE_MSG;

			msg->c2s_request.CMD = buf[1];
			auto addrlen = resolvAddr(&msg->c2s_request.ADDR, (uint8_t*)&buf[2]);
			if(addrlen <= 0)
				return INVALID_MSG;

			if (addrlen + 2 == msgLen)
				return msgLen;

			return INVALID_MSG;
		}break;
		case PIPEMSG_TYPE::S2C_RESPONSE:
		{
			if (len >= 2)
			{
				if (buf[1] >= 0 && buf[1] < S2C_RESPONSE_CODE::CODE_NONE)
				{
					msg->s2c_response.CODE = (S2C_RESPONSE_CODE)buf[1];
					return 2;
				}
				return INVALID_MSG;
			}
			return WAITE_MSG;
		}break;
		case PIPEMSG_TYPE::SEND_TCP_DATA:
		{
			if (len < 2)
				return WAITE_MSG;

			if (check_method(buf[1]) == false)
				return INVALID_MSG;

			if (len < 6)
				return WAITE_MSG;

			uint32_t msgLen = (uint32_t)readUint32InBigEndian((void*)&buf[2]);
			if (msgLen <= 6 || msgLen > MSG_MAX_SIZE)
				return INVALID_MSG;

			if (len < msgLen)
				return WAITE_MSG;

			msg->common_tcp_data.METHOD = buf[1];

			auto dataLen = msgLen - 6;

			msg->common_tcp_data.LEN = dataLen;
			msg->common_tcp_data.DATA = (uint8_t*)fc_malloc(dataLen);
			memcpy(msg->common_tcp_data.DATA, buf + 6, dataLen);

			return msgLen;

		}break;
		case PIPEMSG_TYPE::C2S_UDP_DATA:
		case PIPEMSG_TYPE::S2C_UDP_DATA:
		{
			if (len < 2)
				return WAITE_MSG;

			if (check_method(buf[1]) == false)
				return INVALID_MSG;

			if (len < 7)
				return WAITE_MSG;

			uint32_t msgLen = (uint32_t)readUint32InBigEndian((void*)&buf[2]);
			if (msgLen <= 13 || msgLen > MSG_MAX_SIZE)
				return INVALID_MSG;

			uint8_t ATYP = buf[6];
			if (false == check_atyp(ATYP))
				return INVALID_MSG;

			if (len < 8)
				return WAITE_MSG;

			uint8_t ADDR_LEN = 4;
			if (ATYP == SOKS5_ATYP_DOMAIN)
			{
				if (buf[7] <= 0)
					return INVALID_MSG;
				ADDR_LEN = buf[7] + 1;
			}
			else if (ATYP == SOKS5_ATYP_IPV6)
			{
				ADDR_LEN = 16;
			}

			if (msgLen <= 9 + ADDR_LEN || msgLen > MSG_MAX_SIZE)
				return INVALID_MSG;

			if (len < msgLen)
				return WAITE_MSG;
			
			msg->common_udp_data.METHOD = buf[1];
				
			auto addrlen = resolvAddr(&msg->common_udp_data.ADDR, (uint8_t*)&buf[6]);
			if (addrlen <= 0 || addrlen != ADDR_LEN + 3)
				return INVALID_MSG;

			auto dataLen = msgLen - addrlen - 6;
			if (dataLen <= 0)
				return INVALID_MSG;

			msg->common_udp_data.LEN = dataLen;
			msg->common_udp_data.DATA = (uint8_t*)fc_malloc(dataLen);
			memcpy(msg->common_udp_data.DATA, buf + 6 + addrlen, dataLen);

			return msgLen;
		}break;
		case PIPEMSG_TYPE::S2C_DISCONNECT:
		{
			return 1;
		}break;
		case PIPEMSG_TYPE::S2C_CANNOT_RESOLVE_ADDR:
		{
			return 1;
		}break;
	}
	assert(0);
	return INVALID_MSG;
}